

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::printApertures(Station *this)

{
  int iVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  int a;
  long lVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Angle ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->angle);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar4 = 0; lVar4 < this->max_apertures; lVar4 = lVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"aperture ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = 0;
    while( true ) {
      iVar1 = Collimator::getXdim(this->collimator);
      if (iVar1 <= lVar3) break;
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)&(this->A).
                                             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data + lVar3 * 8));
      poVar2 = std::operator<<(poVar2,"-");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,
                          *(int *)(*(long *)&(this->A).
                                             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data + 4 + lVar3 * 8));
      std::endl<char,std::char_traits<char>>(poVar2);
      lVar3 = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void Station::printApertures() {
    cout << "Angle "<< angle << endl;
    for (int a=0; a<max_apertures;a++) {
      cout << "aperture " << a << endl;
      for (int i=0; i<collimator.getXdim(); i++) {
        cout << A[a][i].first << "-" << A[a][i].second << endl;
      }
    }
  }